

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

ulong __thiscall smf::MidiFile::readVLValue(MidiFile *this,istream *input)

{
  bool bVar1;
  uchar uVar2;
  ulong in_RAX;
  ulong uVar3;
  uchar (*__range1) [5];
  long lVar4;
  ulong unaff_R14;
  uchar b [5];
  undefined8 local_28;
  
  local_28 = in_RAX & 0xffffff0000000000;
  lVar4 = 0;
  while( true ) {
    uVar2 = readByte(this,input);
    *(uchar *)((long)&local_28 + lVar4) = uVar2;
    bVar1 = this->m_rwstatus;
    if (bVar1 == false) {
      unaff_R14 = 0;
    }
    if ((-1 < (char)uVar2) || (bVar1 == false)) break;
    lVar4 = lVar4 + 1;
    if (lVar4 == 5) {
LAB_0011780f:
      uVar3 = unpackVLV(this,(uchar)local_28,local_28._1_1_,local_28._2_1_,local_28._3_1_,
                        local_28._4_1_);
      return uVar3;
    }
  }
  if ((-1 < (char)uVar2 & bVar1) != 1) {
    return unaff_R14;
  }
  goto LAB_0011780f;
}

Assistant:

ulong MidiFile::readVLValue(std::istream& input) {
	uchar b[5] = {0};

    for (uchar &item : b) {
            item = readByte(input);
            if (!status()) {
                    return m_rwstatus;
            }
            if (item < 0x80) {
                    break;
            }
    }

    return unpackVLV(b[0], b[1], b[2], b[3], b[4]);
}